

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Slice __thiscall leveldb::Version::LevelFileNumIterator::key(LevelFileNumIterator *this)

{
  int iVar1;
  Slice SVar2;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    SVar2 = InternalKey::Encode(&(this->flist_->
                                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start[this->index_]->largest);
    return SVar2;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0xbe,"virtual Slice leveldb::Version::LevelFileNumIterator::key() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return (*flist_)[index_]->largest.Encode();
  }